

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t FASTCOVER_hashPtrToIndex(void *p,U32 f,uint d)

{
  int in_EDX;
  U32 in_ESI;
  void *in_RDI;
  undefined8 local_8;
  
  if (in_EDX == 6) {
    local_8 = ZSTD_hash6Ptr(in_RDI,in_ESI);
  }
  else {
    local_8 = ZSTD_hash8Ptr(in_RDI,in_ESI);
  }
  return local_8;
}

Assistant:

static size_t FASTCOVER_hashPtrToIndex(const void* p, U32 f, unsigned d) {
  if (d == 6) {
    return ZSTD_hash6Ptr(p, f);
  }
  return ZSTD_hash8Ptr(p, f);
}